

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv.cpp
# Opt level: O3

dxil_spv_bool
remap_srv(void *userdata,dxil_spv_d3d_binding *binding,dxil_spv_srv_vulkan_binding *vk_binding)

{
  char cVar1;
  int32_t iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined4 uVar6;
  long lVar7;
  byte bVar8;
  
  (vk_binding->offset_binding).root_constant_index = 0;
  (vk_binding->offset_binding).bindless.heap_root_offset = 0;
  *(undefined8 *)&(vk_binding->offset_binding).bindless.use_heap = 0;
  *(undefined8 *)&(vk_binding->buffer_binding).bindless.use_heap = 0;
  (vk_binding->offset_binding).set = 0;
  (vk_binding->offset_binding).binding = 0;
  (vk_binding->buffer_binding).set = 0;
  (vk_binding->buffer_binding).binding = 0;
  (vk_binding->buffer_binding).root_constant_index = 0;
  (vk_binding->buffer_binding).bindless.heap_root_offset = 0;
  iVar2 = find_root_descriptor_index
                    (*(Remapper **)((long)userdata + 0x20),
                     *(dxil_spv_d3d_binding **)((long)userdata + 0x28),
                     (dxil_spv_resource_class)binding);
  if (iVar2 < 0) {
    uVar3 = binding->register_space;
    uVar4 = binding->register_index;
    if (((uVar4 & uVar3) == 0xffffffff) && (binding->range_size == 0xffffffff)) {
      (vk_binding->buffer_binding).bindless.use_heap = '\x01';
      bVar8 = 1;
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      if (*(char *)((long)userdata + 0x68) == '\x01') {
        (vk_binding->buffer_binding).bindless.use_heap = '\x01';
        (vk_binding->buffer_binding).bindless.heap_root_offset = uVar4;
        uVar3 = (uint)(binding->kind - DXIL_SPV_RESOURCE_KIND_TYPED_BUFFER < 3);
        (vk_binding->buffer_binding).root_constant_index = uVar3;
        uVar4 = 0;
      }
      else {
        (vk_binding->buffer_binding).bindless.use_heap = '\0';
      }
      bVar8 = 0;
    }
    (vk_binding->buffer_binding).set = uVar3;
    (vk_binding->buffer_binding).binding = uVar4;
    if (binding->kind == DXIL_SPV_RESOURCE_KIND_RT_ACCELERATION_STRUCTURE) {
      iVar2 = 0;
      lVar5 = 0x1c;
      uVar6 = 0xf;
      lVar7 = 0x18;
      if ((bVar8 | *(byte *)((long)userdata + 0x68)) != 1) goto LAB_0012c2c0;
      cVar1 = *(char *)((long)userdata + 0x6d);
    }
    else {
      iVar2 = 0;
      lVar5 = 0x1c;
      uVar6 = 0xf;
      lVar7 = 0x18;
      if (1 < binding->kind - DXIL_SPV_RESOURCE_KIND_RAW_BUFFER) goto LAB_0012c2c0;
      cVar1 = *(char *)((long)userdata + 0x6c);
    }
    uVar6 = 0xf;
    iVar2 = 0;
    lVar7 = 0x18;
    lVar5 = 0x1c;
    if (cVar1 != '\0') {
      lVar7 = 0x18;
      lVar5 = 0x1c;
      uVar6 = 0xf;
      (vk_binding->buffer_binding).descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;
      iVar2 = 0;
    }
  }
  else {
    lVar5 = 8;
    uVar6 = 3;
    lVar7 = 0x14;
  }
LAB_0012c2c0:
  *(undefined4 *)((long)&(vk_binding->buffer_binding).set + lVar7) = uVar6;
  *(int32_t *)((long)&(vk_binding->buffer_binding).set + lVar5) = iVar2;
  return '\x01';
}

Assistant:

static dxil_spv_bool remap_srv(void *userdata, const dxil_spv_d3d_binding *binding, dxil_spv_srv_vulkan_binding *vk_binding)
{
	auto *remapper = static_cast<Remapper *>(userdata);
	*vk_binding = {};

	int32_t desc_index = find_root_descriptor_index(remapper, binding, DXIL_SPV_RESOURCE_CLASS_SRV);
	if (desc_index >= 0)
	{
		vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_BUFFER_DEVICE_ADDRESS;
		vk_binding->buffer_binding.root_constant_index = uint32_t(desc_index);
	}
	else
	{
		bool is_global_heap = d3d_binding_is_global_heap(*binding);

		if (is_global_heap)
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_TRUE;
			vk_binding->buffer_binding.set = 0;
			vk_binding->buffer_binding.binding = 0;
		}
		else if (remapper->bindless)
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_TRUE;
			vk_binding->buffer_binding.bindless.heap_root_offset = binding->register_index;
			vk_binding->buffer_binding.root_constant_index = kind_is_buffer(binding->kind) ? 1 : 0;
			vk_binding->buffer_binding.set = kind_is_buffer(binding->kind) ? 1 : 0;
			vk_binding->buffer_binding.binding = 0;
		}
		else
		{
			vk_binding->buffer_binding.bindless.use_heap = DXIL_SPV_FALSE;
			vk_binding->buffer_binding.set = binding->register_space;
			vk_binding->buffer_binding.binding = binding->register_index;
		}

		if (binding->kind == DXIL_SPV_RESOURCE_KIND_RT_ACCELERATION_STRUCTURE)
			if ((remapper->bindless || is_global_heap) && remapper->ssbo_rtas)
				vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;

		if (remapper->ssbo_srv)
		{
			if (binding->kind == DXIL_SPV_RESOURCE_KIND_STRUCTURED_BUFFER ||
			    binding->kind == DXIL_SPV_RESOURCE_KIND_RAW_BUFFER)
			{
				vk_binding->buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_SSBO;
			}
		}

		// In case it's needed, place offset buffer here.
		vk_binding->offset_binding.set = 15;
		vk_binding->offset_binding.binding = 0;
	}

	return DXIL_SPV_TRUE;
}